

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.hpp
# Opt level: O3

QpSolverStatus __thiscall
CholeskyFactor::expand(CholeskyFactor *this,QpVector *yp,QpVector *gyp,QpVector *l,QpVector *m)

{
  double dVar1;
  int iVar2;
  pointer pdVar3;
  QpSolverStatus QVar4;
  uint uVar5;
  double *pdVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  
  QVar4 = OK;
  if (this->uptodate == true) {
    dVar9 = 0.0;
    if (0 < (long)gyp->num_nz) {
      lVar7 = 0;
      do {
        iVar2 = (gyp->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar7];
        dVar9 = dVar9 + (gyp->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar2] *
                        (yp->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar2];
        lVar7 = lVar7 + 1;
      } while (gyp->num_nz != lVar7);
    }
    QpVector::resparsify(l);
    dVar10 = 0.0;
    if (0 < (long)l->num_nz) {
      lVar7 = 0;
      do {
        dVar1 = (l->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start
                [(l->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar7]];
        dVar10 = dVar10 + dVar1 * dVar1;
        lVar7 = lVar7 + 1;
      } while (l->num_nz != lVar7);
    }
    dVar9 = dVar9 - dVar10;
    QVar4 = NOTPOSITIVDEFINITE;
    if (0.0 < dVar9) {
      uVar5 = this->current_k;
      if (this->current_k_max <= (int)(uVar5 + 1)) {
        resize(this,this->current_k_max * 2);
        uVar5 = this->current_k;
      }
      if (0 < (int)uVar5) {
        pdVar3 = (l->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar2 = this->current_k_max;
        pdVar6 = (this->L).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar5;
        uVar8 = 0;
        do {
          *pdVar6 = pdVar3[uVar8];
          uVar8 = uVar8 + 1;
          pdVar6 = pdVar6 + iVar2;
        } while (uVar5 != uVar8);
      }
      if (dVar9 < 0.0) {
        dVar9 = sqrt(dVar9);
      }
      else {
        dVar9 = SQRT(dVar9);
      }
      iVar2 = this->current_k;
      (this->L).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[(this->current_k_max + 1) * iVar2] = dVar9;
      this->current_k = iVar2 + 1;
      QVar4 = OK;
    }
  }
  return QVar4;
}

Assistant:

QpSolverStatus expand(const QpVector& yp, QpVector& gyp, QpVector& l,
                        QpVector& m) {
    if (!uptodate) {
      return QpSolverStatus::OK;
    }
    double mu = gyp * yp;
    l.resparsify();
    double lambda = mu - l.norm2();
    if (lambda > 0.0) {
      if (current_k_max <= current_k + 1) {
        resize(current_k_max * 2);
      }

      for (HighsInt i = 0; i < current_k; i++) {
        L[i * current_k_max + current_k] = l.value[i];
      }
      L[current_k * current_k_max + current_k] = sqrt(lambda);

      current_k++;
    } else {
      return QpSolverStatus::NOTPOSITIVDEFINITE;

      //     |LL' 0|
      // M = |0'  0| + bb' -aa'
      // a = (k * m, alpha), b = (k * m, beta)
      // b*b -a*a = mu
      // k(b-a) = 1
      // b + a = k*mu
      // Commented out unreachable code
      //      const double tolerance = 0.001;
      //
      //      double beta = max(tolerance, sqrt(m.norm2() / L[0] + fabs(mu)));
      //      double k = 1 / (beta + sqrt(beta * beta - mu));
      //      double alpha = k * mu - beta;
      //
      //      printf("k = %d, alpha = %lf, beta = %lf, k = %lf\n",
      //      (int)current_k, alpha,
      //             beta, k);
      //
      //      a.clear();
      //      a.resize(current_k + 1);
      //      for (HighsInt i = 0; i < current_k; i++) {
      //        a[i] = k * m.value[i];
      //      }
      //      a[current_k] = alpha;
      //
      //      std::vector<double> b(current_k + 1);
      //      for (HighsInt i = 0; i < current_k; i++) {
      //        b[i] = k * m.value[i];
      //      }
      //      b[current_k] = beta;
      //
      //      if (current_k_max <= current_k + 1) {
      //        resize(current_k_max * 2);
      //      }
      //
      //      // append b to the left of L
      //      for (HighsInt row = current_k; row > 0; row--) {
      //        // move row one position down
      //        for (HighsInt i = 0; i < current_k; i++) {
      //          L[row * current_k_max + i] = L[(row - 1) * current_k_max + i];
      //        }
      //      }
      //      for (HighsInt i = 0; i < current_k + 1; i++) {
      //        L[i] = b[i];
      //      }
      //
      //      // re-triangulize
      //      for (HighsInt i = 0; i < current_k + 1; i++) {
      //        eliminate(L, i, i + 1, current_k_max, current_k + 1);
      //      }
      //
      //      current_k = current_k + 1;
    }
    return QpSolverStatus::OK;
  }